

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

uchar * duckdb_shell_sqlite3_value_text(sqlite3_value *pVal)

{
  SQLiteTypeValue SVar1;
  pointer __src;
  string_t input;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  uchar *puVar5;
  Value value;
  undefined8 uStackY_a4;
  undefined4 local_9c;
  MemValue local_98;
  SQLiteTypeValue local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  sqlite3 *local_68;
  Value local_60;
  
  if (pVal != (sqlite3_value *)0x0) {
    SVar1 = pVal->type;
    if (SVar1 - 1 < 2) {
      if (SVar1 == INTEGER) {
        duckdb::Value::BIGINT(&local_60,(pVal->u).i);
      }
      else {
        duckdb::Value::DOUBLE(&local_60,(pVal->u).r);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)&local_98,VARCHAR);
      bVar2 = duckdb::Value::DefaultTryCastAs(&local_60,(LogicalType *)&local_98,false);
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_98);
      if (bVar2) {
        psVar4 = duckdb::StringValue::Get_abi_cxx11_(&local_60);
        __src = (psVar4->_M_dataplus)._M_p;
        uVar3 = (uint)psVar4->_M_string_length;
        if (uVar3 < 0xd) {
          local_9c = 0;
          uStackY_a4 = 0;
          if (uVar3 != 0) {
            switchD_015df945::default(&uStackY_a4,__src,(ulong)(uVar3 & 0xf));
          }
        }
        else {
          uStackY_a4 = CONCAT44(uStackY_a4._4_4_,*(undefined4 *)__src);
        }
        input.value.pointer.ptr = (char *)in_stack_ffffffffffffff80;
        input.value._0_8_ = in_stack_ffffffffffffff78;
        duckdb::CastToSQLiteValue::Operation<duckdb::string_t>(input);
        pVal->type = local_90;
        pVal->u = local_98;
        std::__cxx11::string::operator=((string *)&pVal->str,(string *)&stack0xffffffffffffff78);
        pVal->db = local_68;
        if (in_stack_ffffffffffffff78 != &local_78) {
          operator_delete(in_stack_ffffffffffffff78);
        }
        puVar5 = (uchar *)(pVal->str)._M_dataplus._M_p;
      }
      else {
        pVal->db->errCode = 7;
        puVar5 = (uchar *)0x0;
      }
      duckdb::Value::~Value(&local_60);
      return puVar5;
    }
    if (SVar1 - 3 < 2) {
      return (uchar *)(pVal->str)._M_dataplus._M_p;
    }
    if (SVar1 != NULL_VALUE) {
      pVal->db->errCode = 0x14;
    }
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *sqlite3_value_text(sqlite3_value *pVal) {
	if (!pVal) {
		return nullptr;
	}
	if (pVal->type == SQLiteTypeValue::TEXT || pVal->type == SQLiteTypeValue::BLOB) {
		return (const unsigned char *)pVal->str.c_str();
	}

	if (pVal->type == SQLiteTypeValue::INTEGER || pVal->type == SQLiteTypeValue::FLOAT) {
		Value value = (pVal->type == SQLiteTypeValue::INTEGER) ? Value::BIGINT(pVal->u.i) : Value::DOUBLE(pVal->u.r);
		if (!value.DefaultTryCastAs(LogicalType::VARCHAR)) {
			pVal->db->errCode = SQLITE_NOMEM;
			return nullptr;
		}
		auto &str_val = StringValue::Get(value);
		*pVal = CastToSQLiteValue::Operation<string_t>(string_t(str_val));
		return (const unsigned char *)pVal->str.c_str();
	}
	if (pVal->type == SQLiteTypeValue::NULL_VALUE) {
		return nullptr;
	}
	pVal->db->errCode = SQLITE_MISMATCH;
	return nullptr;
}